

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_lookup_path_modify(Tree *this,lookup_result *r)

{
  error_flags eVar1;
  size_t *in_RSI;
  bool bVar2;
  size_t node;
  _lookup_path_token parent;
  _lookup_path_token *in_stack_00000520;
  lookup_result *in_stack_00000528;
  Tree *in_stack_00000530;
  Tree *in_stack_ffffffffffffff48;
  lookup_result *in_stack_ffffffffffffff50;
  bool local_91;
  csubstr local_88;
  size_t local_78;
  char *local_70;
  csubstr local_68;
  _lookup_path_token local_58;
  char *local_40;
  undefined4 local_38;
  csubstr local_30;
  size_t *local_20;
  lookup_result *local_10;
  csubstr *local_8;
  
  local_20 = in_RSI;
  local_30 = lookup_result::unresolved(in_stack_ffffffffffffff50);
  local_8 = &local_30;
  local_91 = true;
  if (local_30.len != 0) {
    local_91 = local_30.str == (char *)0x0;
  }
  if (local_91) {
    eVar1 = get_error_flags();
    if (((eVar1 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    local_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x68f9;
    handle_error(0x34dd90,(char *)0x68f9,"check failed: %s","! r->unresolved().empty()");
  }
  basic_substring<char_const>::basic_substring<1ul>
            ((basic_substring<char_const> *)&local_68,(char (*) [1])0x361d1e);
  local_70 = (char *)type(in_stack_ffffffffffffff48,0x2f416d);
  _lookup_path_token::_lookup_path_token(&local_58,local_68,(NodeType)local_70);
  while( true ) {
    local_78 = _next_node_modify(in_stack_00000530,in_stack_00000528,in_stack_00000520);
    if (local_78 != 0xffffffffffffffff) {
      local_20[1] = local_78;
    }
    local_88 = lookup_result::unresolved(in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff50 = (lookup_result *)&local_88;
    bVar2 = true;
    if (local_88.len != 0) {
      bVar2 = local_88.str == (char *)0x0;
    }
    if (bVar2) break;
    local_10 = in_stack_ffffffffffffff50;
    if (local_78 == 0xffffffffffffffff) {
      return;
    }
  }
  *local_20 = local_78;
  return;
}

Assistant:

void Tree::_lookup_path_modify(lookup_result *r)
{
    C4_ASSERT( ! r->unresolved().empty());
    _lookup_path_token parent{"", type(r->closest)};
    size_t node;
    do
    {
        node = _next_node_modify(r, &parent);
        if(node != NONE)
            r->closest = node;
        if(r->unresolved().empty())
        {
            r->target = node;
            return;
        }
    } while(node != NONE);
}